

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void leveldb::SaveValue(void *arg,Slice *ikey,Slice *v)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  ParsedInternalKey parsed_key;
  ParsedInternalKey local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.user_key.data_ = "";
  local_38.user_key.size_ = 0;
  bVar1 = ParseInternalKey(ikey,&local_38);
  if (bVar1) {
    iVar2 = (**(code **)(**(long **)((long)arg + 8) + 0x10))
                      (*(long **)((long)arg + 8),&local_38,(long)arg + 0x10);
    if ((iVar2 == 0) &&
       (*(uint *)arg = (local_38.type != kTypeValue) + 1, local_38.type == kTypeValue)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)arg + 0x20),v->data_,v->size_);
    }
  }
  else {
    *(undefined4 *)arg = 3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SaveValue(void* arg, const Slice& ikey, const Slice& v) {
  Saver* s = reinterpret_cast<Saver*>(arg);
  ParsedInternalKey parsed_key;
  if (!ParseInternalKey(ikey, &parsed_key)) {
    s->state = kCorrupt;
  } else {
    if (s->ucmp->Compare(parsed_key.user_key, s->user_key) == 0) {
      s->state = (parsed_key.type == kTypeValue) ? kFound : kDeleted;
      if (s->state == kFound) {
        s->value->assign(v.data(), v.size());
      }
    }
  }
}